

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboRepeatedClearSampleTex2DCase::render
          (FboRepeatedClearSampleTex2DCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  DataType DVar1;
  deUint32 program;
  DataTypes *samplerTypes;
  Context *pCVar2;
  long lVar3;
  int iVar4;
  int x;
  deUint32 textures [2];
  TextureFormat fboFormat;
  deUint32 fbos [2];
  Random rnd;
  Vec3 local_238;
  Vector<float,_4> local_228;
  Vec4 color;
  TextureFormatInfo fmtInfo;
  Texture2DShader fboBlitShader;
  
  fboFormat = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&fboFormat);
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  DVar1 = glu::getSampler2DType(fboFormat);
  samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)&rnd,DVar1);
  DVar1 = FboTestUtil::getFragmentOutputType(&fboFormat);
  tcu::Vector<float,_4>::Vector(&color,1.0);
  tcu::Vector<float,_4>::Vector(&local_228,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader(&fboBlitShader,samplerTypes,DVar1,&color,&local_228)
  ;
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&rnd);
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar2->_vptr_Context[0x75])(pCVar2,&fboBlitShader);
  deRandom_init(&rnd.m_rnd,0x1153f3e);
  fbos[0] = 0;
  fbos[1] = 0;
  textures[0] = 0;
  textures[1] = 0;
  sglr::ContextWrapper::glGenFramebuffers(this_00,2,fbos);
  sglr::ContextWrapper::glGenTextures(this_00,2,textures);
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,*(deUint32 *)((long)textures + lVar3));
    sglr::ContextWrapper::glTexStorage2D
              (this_00,0xde1,1,(this->super_FboColorbufferCase).m_format,
               *(int *)((long)&DAT_018287f8 + lVar3),*(int *)((long)&DAT_018287f8 + lVar3));
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
    FboTestCase::checkError((FboTestCase *)this);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,*(deUint32 *)((long)fbos + lVar3));
    sglr::ContextWrapper::glFramebufferTexture2D
              (this_00,0x8d40,0x8ce0,0xde1,*(deUint32 *)((long)textures + lVar3),0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
  }
  tcu::Vector<float,_4>::Vector(&color,0.0);
  FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&fboBlitShader,pCVar2,program);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,textures[0]);
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    for (x = 0; x != 0x40; x = x + 0x10) {
      randomVector<4>((Functional *)&color,&rnd,&fmtInfo.valueMin,&fmtInfo.valueMax);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[0]);
      FboTestCase::clearColorBuffer((FboTestCase *)this,&fboFormat,&color);
      sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbos[1]);
      sglr::ContextWrapper::glViewport(this_00,x,iVar4 << 4,0x10,0x10);
      pCVar2 = sglr::ContextWrapper::getCurrentContext(this_00);
      local_228.m_data[0] = -1.0;
      local_228.m_data[1] = -1.0;
      local_228.m_data[2] = 0.0;
      local_238.m_data[0] = 1.0;
      local_238.m_data[1] = 1.0;
      local_238.m_data[2] = 0.0;
      sglr::drawQuad(pCVar2,program,(Vec3 *)&local_228,&local_238);
    }
  }
  FboTestCase::readPixels
            ((FboTestCase *)this,dst,0,0,0x40,0x40,&fboFormat,&fmtInfo.lookupScale,
             &fmtInfo.lookupBias);
  FboTestCase::checkError((FboTestCase *)this);
  FboTestUtil::Texture2DShader::~Texture2DShader(&fboBlitShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const tcu::TextureFormat		fboFormat		= glu::mapGLInternalFormat(m_format);
		const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(fboFormat);
		const int						numRowsCols		= 4;
		const int						cellSize		= 16;
		const int						fboSizes[]		= { cellSize, cellSize*numRowsCols };

		Texture2DShader					fboBlitShader	(DataTypes() << glu::getSampler2DType(fboFormat), getFragmentOutputType(fboFormat), Vec4(1.0f), Vec4(0.0f));
		const deUint32					fboBlitShaderID	= getCurrentContext()->createProgram(&fboBlitShader);

		de::Random						rnd				(18169662);
		deUint32						fbos[]			= { 0, 0 };
		deUint32						textures[]		= { 0, 0 };

		glGenFramebuffers(2, &fbos[0]);
		glGenTextures(2, &textures[0]);

		for (int fboNdx = 0; fboNdx < DE_LENGTH_OF_ARRAY(fbos); fboNdx++)
		{
			glBindTexture(GL_TEXTURE_2D, textures[fboNdx]);
			glTexStorage2D(GL_TEXTURE_2D, 1, m_format, fboSizes[fboNdx], fboSizes[fboNdx]);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
			checkError();

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[fboNdx]);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textures[fboNdx], 0);
			checkError();
			checkFramebufferStatus(GL_FRAMEBUFFER);
		}

		// larger fbo bound -- clear to transparent black
		clearColorBuffer(fboFormat, Vec4(0.0f));

		fboBlitShader.setUniforms(*getCurrentContext(), fboBlitShaderID);
		glBindTexture(GL_TEXTURE_2D, textures[0]);

		for (int cellY = 0; cellY < numRowsCols; cellY++)
		for (int cellX = 0; cellX < numRowsCols; cellX++)
		{
			const Vec4	color	= randomVector<4>(rnd, fmtInfo.valueMin, fmtInfo.valueMax);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[0]);
			clearColorBuffer(fboFormat, color);

			glBindFramebuffer(GL_FRAMEBUFFER, fbos[1]);
			glViewport(cellX*cellSize, cellY*cellSize, cellSize, cellSize);
			sglr::drawQuad(*getCurrentContext(), fboBlitShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, fboSizes[1], fboSizes[1], fboFormat, fmtInfo.lookupScale, fmtInfo.lookupBias);
		checkError();
	}